

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::setZAxis(Skeleton *this,Vector3D *axis)

{
  double dVar1;
  undefined1 local_50 [8];
  Vector3D rot_axis;
  undefined1 local_30 [4];
  float rot_angle;
  Vector3D zAxis;
  Vector3D *axis_local;
  Skeleton *this_local;
  
  zAxis.z = (double)axis;
  Vector3D::Vector3D((Vector3D *)local_30,0.0,0.0,1.0);
  Vector3D::normalize(axis);
  dVar1 = dot(axis,(Vector3D *)local_30);
  dVar1 = acos(dVar1);
  rot_axis.z._4_4_ = (float)dVar1;
  dVar1 = std::fabs((double)(ulong)(uint)rot_axis.z._4_4_);
  if (1e-05 < SUB84(dVar1,0)) {
    rot_axis.z._4_4_ = (-rot_axis.z._4_4_ * 180.0) / 3.1415927;
    cross((Vector3D *)local_50,axis,(Vector3D *)local_30);
    Vector3D::normalize((Vector3D *)local_50);
    glRotatef();
  }
  return;
}

Assistant:

void Skeleton::setZAxis(Vector3D axis)
  {
    Vector3D zAxis(0., 0., 1.);
    axis.normalize();
    float rot_angle = acos(dot(axis, zAxis));
    if (fabs(rot_angle) > 10E-6)
    {
      rot_angle = -rot_angle * 180 / M_PI;
      Vector3D rot_axis = cross(axis, zAxis);
      rot_axis.normalize();
      glRotatef(rot_angle, rot_axis.x, rot_axis.y, rot_axis.z);
    }
  }